

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

Matrix * __thiscall
sptk::Matrix::operator*(Matrix *__return_storage_ptr__,Matrix *this,Matrix *matrix)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  pointer ppdVar4;
  pointer ppdVar5;
  pointer ppdVar6;
  double *pdVar7;
  double *pdVar8;
  logic_error *this_00;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  
  if (this->num_column_ == matrix->num_row_) {
    Matrix(__return_storage_ptr__,this->num_row_,matrix->num_column_);
    iVar1 = this->num_row_;
    if (0 < (long)iVar1) {
      uVar2 = matrix->num_column_;
      uVar3 = this->num_column_;
      lVar9 = 0;
      do {
        if (0 < (int)uVar2) {
          ppdVar4 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppdVar5 = (matrix->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl
                    .super__Vector_impl_data._M_start;
          ppdVar6 = (__return_storage_ptr__->index_).
                    super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar10 = 0;
          do {
            if (0 < (int)uVar3) {
              pdVar7 = ppdVar4[lVar9];
              pdVar8 = ppdVar6[lVar9];
              dVar12 = pdVar8[uVar10];
              uVar11 = 0;
              do {
                dVar12 = dVar12 + pdVar7[uVar11] * ppdVar5[uVar11][uVar10];
                pdVar8[uVar10] = dVar12;
                uVar11 = uVar11 + 1;
              } while (uVar3 != uVar11);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar2);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Matrix: Matrix sizes do not match");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Matrix Matrix::operator*(const Matrix& matrix) const {
  if (num_column_ != matrix.num_row_) {
    throw std::logic_error(kErrorMessageForLogicError);
  }
  Matrix result(num_row_, matrix.num_column_);
  for (int i(0); i < num_row_; ++i) {
    for (int j(0); j < matrix.num_column_; ++j) {
      for (int k(0); k < num_column_; ++k) {
        result.index_[i][j] += index_[i][k] * matrix.index_[k][j];
      }
    }
  }
  return result;
}